

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ProgramAttachedShadersCase::test
          (ProgramAttachedShadersCase *this)

{
  qpTestResult qVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_648;
  MessageBuilder local_4c8;
  GLsizei local_344;
  GLuint local_340;
  GLint count_1;
  GLuint shaders_1 [2];
  MessageBuilder local_1a8;
  GLsizei local_28;
  GLuint local_24;
  GLint count;
  GLuint shaders [2];
  GLuint program;
  GLuint shaderFrag;
  GLuint shaderVert;
  ProgramAttachedShadersCase *this_local;
  
  _shaderFrag = this;
  program = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b31);
  shaders[1] = glu::CallLogWrapper::glCreateShader
                         (&(this->super_ApiCase).super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,program,1,
             &(anonymous_namespace)::commonTestVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shaders[1],1,
             &(anonymous_namespace)::commonTestFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,program);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shaders[1]);
  ApiCase::expectError(&this->super_ApiCase,0);
  shaders[0] = glu::CallLogWrapper::glCreateProgram(&(this->super_ApiCase).super_CallLogWrapper);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,shaders[0],0x8b85,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ApiCase).super_CallLogWrapper,shaders[0],program);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,shaders[0],0x8b85,1);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ApiCase).super_CallLogWrapper,shaders[0],shaders[1]);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,shaders[0],0x8b85,2);
  ApiCase::expectError(&this->super_ApiCase,0);
  memset(&local_24,0,8);
  local_28 = 0;
  glu::CallLogWrapper::glGetAttachedShaders
            (&(this->super_ApiCase).super_CallLogWrapper,shaders[0],2,&local_28,&local_24);
  if (local_28 != 2) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_1a8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [27])"// ERROR: Expected 2; got ")
    ;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_28);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got wrong shader count");
    }
  }
  if (((local_24 != program) || (count != shaders[1])) &&
     ((local_24 != shaders[1] || (count != program)))) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<
              ((MessageBuilder *)shaders_1,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)shaders_1,(char (*) [21])"// ERROR: Expected {");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&program);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0xafd70f);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,shaders + 1);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])"}; got {");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_24);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0xafd70f);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)&count);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xacbdde);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)shaders_1);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got wrong shader count");
    }
  }
  memset(&local_340,0,8);
  local_344 = 0;
  glu::CallLogWrapper::glGetAttachedShaders
            (&(this->super_ApiCase).super_CallLogWrapper,shaders[0],0,&local_344,&local_340);
  if (local_344 != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_4c8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_4c8,(char (*) [27])"// ERROR: Expected 0; got ")
    ;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_344);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4c8);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got wrong shader count");
    }
  }
  local_344 = 0;
  glu::CallLogWrapper::glGetAttachedShaders
            (&(this->super_ApiCase).super_CallLogWrapper,shaders[0],1,&local_344,&local_340);
  if (local_344 != 1) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_648,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_648,(char (*) [27])"// ERROR: Expected 1; got ")
    ;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_344);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_648);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got wrong shader count");
    }
  }
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shaders[1]);
  glu::CallLogWrapper::glDeleteProgram(&(this->super_ApiCase).super_CallLogWrapper,shaders[0]);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &commonTestVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &commonTestFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		// check ATTACHED_SHADERS

		GLuint program = glCreateProgram();
		verifyProgramParam(m_testCtx, *this, program, GL_ATTACHED_SHADERS, 0);
		expectError(GL_NO_ERROR);

		glAttachShader(program, shaderVert);
		verifyProgramParam(m_testCtx, *this, program, GL_ATTACHED_SHADERS, 1);
		expectError(GL_NO_ERROR);

		glAttachShader(program, shaderFrag);
		verifyProgramParam(m_testCtx, *this, program, GL_ATTACHED_SHADERS, 2);
		expectError(GL_NO_ERROR);

		// check GetAttachedShaders
		{
			GLuint shaders[2] = {0, 0};
			GLint count = 0;
			glGetAttachedShaders(program, DE_LENGTH_OF_ARRAY(shaders), &count, shaders);

			if (count != 2)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected 2; got " << count << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong shader count");
			}
			// shaders are the attached shaders?
			if (!((shaders[0] == shaderVert && shaders[1] == shaderFrag) ||
				  (shaders[0] == shaderFrag && shaders[1] == shaderVert)))
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected {" << shaderVert << ", " << shaderFrag << "}; got {" << shaders[0] << ", " << shaders[1] << "}" << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong shader count");
			}
		}

		// check GetAttachedShaders with too small buffer
		{
			GLuint shaders[2] = {0, 0};
			GLint count = 0;

			glGetAttachedShaders(program, 0, &count, shaders);
			if (count != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected 0; got " << count << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong shader count");
			}

			count = 0;
			glGetAttachedShaders(program, 1, &count, shaders);
			if (count != 1)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected 1; got " << count << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong shader count");
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}